

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-alloc-cb-fail.c
# Opt level: O2

int run_test_tcp_alloc_cb_fail(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uStack_80;
  sockaddr_in addr;
  uv_connect_t connect_req;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&connect_req);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&server,&connect_req,0);
      if (iVar1 == 0) {
        iVar1 = uv_listen(&server,0x80,connection_cb);
        if (iVar1 == 0) {
          iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
          if (iVar1 == 0) {
            uVar2 = uv_default_loop();
            iVar1 = uv_tcp_init(uVar2,&client);
            if (iVar1 == 0) {
              iVar1 = uv_tcp_connect(&connect_req,&client,&addr,connect_cb);
              if (iVar1 == 0) {
                uVar2 = uv_default_loop();
                iVar1 = uv_run(uVar2,0);
                if (iVar1 == 0) {
                  if (connect_cb_called == 1) {
                    if (connection_cb_called == 1) {
                      if (close_cb_called == 3) {
                        uVar2 = uv_default_loop();
                        uv_walk(uVar2,close_walk_cb,0);
                        uv_run(uVar2,0);
                        uVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(uVar2);
                        if (iVar1 == 0) {
                          return 0;
                        }
                        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                        uStack_80 = 0x79;
                      }
                      else {
                        pcVar3 = "close_cb_called == 3";
                        uStack_80 = 0x77;
                      }
                    }
                    else {
                      pcVar3 = "connection_cb_called == 1";
                      uStack_80 = 0x76;
                    }
                  }
                  else {
                    pcVar3 = "connect_cb_called == 1";
                    uStack_80 = 0x75;
                  }
                }
                else {
                  pcVar3 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                  uStack_80 = 0x73;
                }
              }
              else {
                pcVar3 = 
                "0 == uv_tcp_connect(&connect_req, &client, (struct sockaddr*) &addr, connect_cb)";
                uStack_80 = 0x71;
              }
            }
            else {
              pcVar3 = "0 == uv_tcp_init(uv_default_loop(), &client)";
              uStack_80 = 0x6d;
            }
          }
          else {
            pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
            uStack_80 = 0x6b;
          }
        }
        else {
          pcVar3 = "0 == uv_listen((uv_stream_t*) &server, 128, connection_cb)";
          uStack_80 = 0x61;
        }
      }
      else {
        pcVar3 = "0 == uv_tcp_bind(&server, (struct sockaddr*) &addr, 0)";
        uStack_80 = 0x60;
      }
    }
    else {
      pcVar3 = "0 == uv_tcp_init(uv_default_loop(), &server)";
      uStack_80 = 0x5f;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uStack_80 = 0x5d;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-alloc-cb-fail.c"
          ,uStack_80,pcVar3);
  abort();
}

Assistant:

static void start_server(void) {
  struct sockaddr_in addr;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &server));
  ASSERT(0 == uv_tcp_bind(&server, (struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server, 128, connection_cb));
}